

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O1

err_t g12sSign(octet *sig,g12s_params *params,octet *hash,octet *privkey,gen_i rng,void *rng_stack)

{
  u64 *dest;
  u32 uVar1;
  ec_o *peVar2;
  word *pwVar3;
  octet *buf;
  word *pwVar4;
  err_t eVar5;
  bool_t bVar6;
  int iVar7;
  u64 *puVar8;
  ulong uVar9;
  void *stack;
  u64 *puVar10;
  uint uVar11;
  ulong n;
  ec_o *ec;
  ec_o *local_88;
  ec_o *local_80;
  u64 *local_78;
  word *local_70;
  octet *local_68;
  word *local_60;
  u64 *local_58;
  ulong local_50;
  word *local_48;
  ulong local_40;
  void *local_38;
  ulong uVar12;
  
  local_88 = (ec_o *)0x0;
  eVar5 = 0x130;
  if ((rng != (gen_i)0x0) && (eVar5 = g12sEcCreate(&local_88,params,g12sSign_deep), eVar5 == 0)) {
    uVar1 = params->l;
    uVar11 = uVar1 + 7 >> 3;
    uVar12 = (ulong)uVar11;
    local_68 = sig;
    bVar6 = memIsValid(hash,uVar12);
    if ((bVar6 != 0) && (bVar6 = memIsValid(privkey,uVar12), bVar6 != 0)) {
      local_40 = (ulong)(uVar11 * 2);
      bVar6 = memIsValid(local_68,local_40);
      if (bVar6 != 0) {
        uVar11 = uVar1 + 0x3f >> 6;
        n = (ulong)uVar11;
        puVar10 = (u64 *)((long)&(local_88->hdr).keep + (local_88->hdr).keep);
        local_80 = local_88;
        local_78 = (u64 *)local_88->f->n;
        u64From(puVar10,privkey,uVar12);
        bVar6 = wwIsZero(puVar10,n);
        if ((bVar6 != 0) || (iVar7 = wwCmp(puVar10,local_80->order,n), -1 < iVar7)) {
          blobClose(local_80);
          return 0x1f8;
        }
        uVar9 = (ulong)(uVar11 * 8);
        dest = (u64 *)((long)puVar10 + uVar9);
        local_70 = (word *)((long)dest + uVar9);
        local_48 = (word *)((long)local_70 + uVar9);
        puVar8 = local_48 + (long)local_78 * 2;
        local_60 = (word *)((long)puVar8 + uVar9);
        stack = (void *)(uVar9 + (long)local_60);
        local_58 = puVar10;
        local_38 = rng_stack;
        memCopy(dest,hash,uVar12);
        memRev(dest,uVar12);
        u64From(dest,dest,uVar12);
        zzMod(dest,dest,n,local_80->order,n,stack);
        bVar6 = wwIsZero(dest,n);
        local_80 = (ec_o *)dest;
        local_78 = puVar8;
        local_50 = uVar12;
        if (bVar6 != 0) {
          *dest = 1;
        }
        while( true ) {
          pwVar3 = local_70;
          peVar2 = local_88;
          bVar6 = zzRandNZMod(local_70,local_88->order,n,rng,local_38);
          pwVar4 = local_48;
          if (bVar6 == 0) {
            blobClose(peVar2);
            return 0x130;
          }
          bVar6 = ecMulA(local_48,peVar2->base,peVar2,pwVar3,n,stack);
          if (bVar6 == 0) break;
          (*local_88->f->to)((octet *)pwVar4,pwVar4,local_88->f,stack);
          puVar10 = local_78;
          peVar2 = local_88;
          u64From(local_78,pwVar4,local_88->f->no);
          zzMod(puVar10,puVar10,peVar2->f->n,peVar2->order,n,stack);
          bVar6 = wwIsZero(puVar10,n);
          uVar12 = local_50;
          pwVar3 = local_70;
          if (bVar6 == 0) {
            zzMulMod(local_70,local_70,(word *)local_80,local_88->order,n,stack);
            pwVar4 = local_60;
            puVar10 = local_78;
            zzMulMod(local_60,local_78,local_58,local_88->order,n,stack);
            peVar2 = local_88;
            zzAddMod(pwVar4,pwVar4,pwVar3,local_88->order,n);
            buf = local_68;
            u64To(local_68,uVar12,pwVar4);
            u64To(buf + uVar12,uVar12,puVar10);
            memRev(buf,local_40);
            blobClose(peVar2);
            return 0;
          }
        }
      }
    }
    blobClose(local_88);
    eVar5 = 0x6d;
  }
  return eVar5;
}

Assistant:

err_t g12sSign(octet sig[], const g12s_params* params, const octet hash[],
	const octet privkey[], gen_i rng, void* rng_stack)
{
	err_t code;
	size_t m, mo;
	// состояние
	ec_o* ec = 0;
	word* d;		/* [m] личный ключ */
	word* e;		/* [m] обработанное хэш-значение */
	word* k;		/* [m] одноразовый ключ */
	word* C;		/* [2n] вспомогательная точка */
	word* r;		/* [m] первая (старшая) часть подписи */
	word* s;		/* [m] вторая часть подписи */
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = g12sEcCreate(&ec, params, g12sSign_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	m = W_OF_B(params->l);
	mo = O_OF_B(params->l);
	// проверить входные указатели
	if (!memIsValid(hash, mo) ||
		!memIsValid(privkey, mo) ||
		!memIsValid(sig, 2 * mo))
	{
		g12sEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	e = d + m;
	k = e + m;
	C = k + m;
	r = C + 2 * ec->f->n;
	s = r + m;
	stack = s + m;
	// загрузить d
	wwFrom(d, privkey, mo);
	if (wwIsZero(d, m) || 
		wwCmp(d, ec->order, m) >= 0)
	{
		g12sEcClose(ec);
		return ERR_BAD_PRIVKEY;
	}
	// e <- hash \mod q
	memCopy(e, hash, mo);
	memRev(e, mo);
	wwFrom(e, e, mo);
	zzMod(e, e, m, ec->order, m, stack);
	// e == 0 => e <- 1
	if (wwIsZero(e, m))
		e[0] = 1;
	// k <-R {1,2,..., q - 1}
gen_k:
	if (!zzRandNZMod(k, ec->order, m, rng, rng_stack))
	{
		g12sEcClose(ec);
		return ERR_BAD_RNG;
	}
	// C <- k P
	if (!ecMulA(C, ec->base, ec, k, m, stack))
	{
		// если params корректны, то этого быть не должно
		g12sEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// r <- x_C \mod q
	qrTo((octet*)C, ecX(C), ec->f, stack);
	wwFrom(r, C, ec->f->no);
	zzMod(r, r, ec->f->n, ec->order, m, stack);
	// r == 0 => повторить генерацию k
	if (wwIsZero(r, m))
		goto gen_k;
	// s <- (rd + ke) \mod q
	zzMulMod(k, k, e, ec->order, m, stack);
	zzMulMod(s, r, d, ec->order, m, stack);
	zzAddMod(s, s, k, ec->order, m);
	// выгрузить ЭЦП
	wwTo(sig, mo, s);
	wwTo(sig + mo, mo, r);
	memRev(sig, 2 * mo);
	// все нормально
	g12sEcClose(ec);
	return ERR_OK;
}